

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O3

XmlRpcValue __thiscall miniros::Subscription::getStats(Subscription *this)

{
  long lVar1;
  int iVar2;
  XmlRpcValue *pXVar3;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  long *plVar4;
  long in_RSI;
  XmlRpcValue XVar5;
  XmlRpcValue conn_data;
  int local_4c;
  pthread_mutex_t *local_48;
  XmlRpcValue local_40;
  
  *(undefined4 *)&this->_vptr_Subscription = 0;
  (this->super_enable_shared_from_this<miniros::Subscription>)._M_weak_this.
  super___weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_40,(string *)(in_RSI + 0x18));
  pXVar3 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,0);
  XmlRpc::XmlRpcValue::operator=(pXVar3,&local_40);
  XmlRpc::XmlRpcValue::invalidate(&local_40);
  local_40._type = TypeInvalid;
  local_40._value.asDouble = 0.0;
  XmlRpc::XmlRpcValue::assertArray(&local_40,0);
  local_48 = (pthread_mutex_t *)(in_RSI + 0x180);
  iVar2 = pthread_mutex_lock(local_48);
  if (iVar2 == 0) {
    plVar4 = *(long **)(in_RSI + 0x168);
    if (plVar4 != *(long **)(in_RSI + 0x170)) {
      do {
        lVar1 = *plVar4;
        local_4c = *(int *)(lVar1 + 0x28);
        pXVar3 = XmlRpc::XmlRpcValue::operator[](&local_40,0);
        pXVar3 = XmlRpc::XmlRpcValue::operator[](pXVar3,0);
        XmlRpc::XmlRpcValue::operator=(pXVar3,&local_4c);
        local_4c = *(int *)(lVar1 + 0x50);
        pXVar3 = XmlRpc::XmlRpcValue::operator[](&local_40,0);
        pXVar3 = XmlRpc::XmlRpcValue::operator[](pXVar3,1);
        XmlRpc::XmlRpcValue::operator=(pXVar3,&local_4c);
        local_4c = *(int *)(lVar1 + 0x58);
        pXVar3 = XmlRpc::XmlRpcValue::operator[](&local_40,0);
        pXVar3 = XmlRpc::XmlRpcValue::operator[](pXVar3,2);
        XmlRpc::XmlRpcValue::operator=(pXVar3,&local_4c);
        local_4c = *(int *)(lVar1 + 0x60);
        pXVar3 = XmlRpc::XmlRpcValue::operator[](&local_40,0);
        pXVar3 = XmlRpc::XmlRpcValue::operator[](pXVar3,3);
        XmlRpc::XmlRpcValue::operator=(pXVar3,&local_4c);
        local_4c = 0;
        pXVar3 = XmlRpc::XmlRpcValue::operator[](&local_40,0);
        pXVar3 = XmlRpc::XmlRpcValue::operator[](pXVar3,4);
        XmlRpc::XmlRpcValue::operator=(pXVar3,&local_4c);
        plVar4 = plVar4 + 2;
      } while (plVar4 != *(long **)(in_RSI + 0x170));
    }
    pXVar3 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,1);
    XmlRpc::XmlRpcValue::operator=(pXVar3,&local_40);
    pthread_mutex_unlock(local_48);
    XmlRpc::XmlRpcValue::invalidate(&local_40);
    XVar5._value.asDouble = extraout_RDX.asDouble;
    XVar5._0_8_ = this;
    return XVar5;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

XmlRpcValue Subscription::getStats()
{
  XmlRpcValue stats;
  stats[0] = name_;
  XmlRpcValue conn_data;
  conn_data.setSize(0);

  std::scoped_lock<std::mutex> lock(publisher_links_mutex_);

  uint32_t cidx = 0;
  for (V_PublisherLink::iterator c = publisher_links_.begin();
       c != publisher_links_.end(); ++c)
  {
    const PublisherLink::Stats& s = (*c)->getStats();
    conn_data[cidx][0] = (*c)->getConnectionID();
    conn_data[cidx][1] = (int)s.bytes_received_;
    conn_data[cidx][2] = (int)s.messages_received_;
    conn_data[cidx][3] = (int)s.drops_;
    conn_data[cidx][4] = 0; // figure out something for this. not sure.
  }

  stats[1] = conn_data;
  return stats;
}